

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

uchar * Exomizer_crunch(uchar *input_data,int input_len,int *retlen)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  uint flag_char;
  char **argv;
  char *pcVar5;
  uchar *__dest;
  size_t __size;
  membuf outbuf [1];
  membuf inbuf [1];
  crunch_info info [1];
  common_flags flags [1];
  char flags_arr [32];
  
  flags[0].options = Exomizer_crunch::options;
  flags[0].outfile = "a.out";
  argv = (char **)malloc(8);
  pcVar5 = strdup("mem_exomizer");
  *argv = pcVar5;
  pcVar5 = fixup_appl(pcVar5);
  G_log_ctx = log_new();
  G_log_ctx->level = LOG_NORMAL;
  G_log_level = LOG_NORMAL;
  log_add_output_stream(G_log_ctx,LOG_WARNING,LOG_MAX,(log_formatter_f *)0x0,_stdout);
  log_add_output_stream(G_log_ctx,LOG_MIN,~LOG_TRACE,(log_formatter_f *)0x0,_stderr);
  if (~LOG_FATAL < G_log_level) {
    G_log_log_level = LOG_DUMP;
    log_log_default("flagind %d\n",(ulong)(uint)flagind);
  }
  sprintf(flags_arr,"bdr%s","cCe:m:M:p:o:qv");
  bVar4 = true;
  bVar3 = false;
  while( true ) {
    bVar1 = bVar3;
    flag_char = getflag(1,argv,flags_arr);
    if (flag_char == 0xffffffff) break;
    if (~LOG_FATAL < G_log_level) {
      G_log_log_level = LOG_DUMP;
      log_log_default(" flagind %d flagopt \'%c\'\n",(ulong)(uint)flagind,(ulong)flag_char);
    }
    bVar3 = true;
    if (flag_char != 0x62) {
      bVar3 = bVar1;
      if (flag_char == 0x72) {
        bVar4 = false;
      }
      else {
        handle_crunch_flags(flag_char,flagarg,print_usage,pcVar5,flags);
      }
    }
  }
  inbuf[0].buf = (void *)0x0;
  inbuf[0].len = 0;
  inbuf[0].size = 0;
  outbuf[0].buf = (void *)0x0;
  outbuf[0].len = 0;
  outbuf[0].size = 0;
  membuf_append(inbuf,input_data,input_len);
  if (bVar1) {
    crunch_backwards(inbuf,outbuf,Exomizer_crunch::options,info);
  }
  else {
    crunch(inbuf,outbuf,Exomizer_crunch::options,info);
  }
  if (!bVar4) {
    reverse_buffer((char *)outbuf[0].buf,outbuf[0].len);
  }
  iVar2 = outbuf[0].len;
  __size = (size_t)outbuf[0].len;
  __dest = (uchar *)malloc(__size);
  memcpy(__dest,outbuf[0].buf,__size);
  *retlen = iVar2;
  membuf_free(outbuf);
  membuf_free(inbuf);
  log_delete(G_log_ctx);
  return __dest;
}

Assistant:

unsigned char *Exomizer_crunch(unsigned char *input_data, int input_len, int *retlen)
{
	int argc=1;
	char **argv=NULL;
    char flags_arr[32];
    int decrunch_mode = 0;
    int backwards_mode = 0;
    int reverse_mode = 0;
    int c, infilec;
    char **infilev;
	/* output buffer */
	unsigned char *output_data;

    static struct crunch_options options[1] = { CRUNCH_OPTIONS_DEFAULT };
    struct common_flags flags[1] = { {options, DEFAULT_OUTFILE} };

    struct membuf inbuf[1];
    struct membuf outbuf[1];

    const char *appl;;


	argv=malloc(sizeof(char *));
	argv[0]=strdup("mem_exomizer");
    /* init args */
    appl = fixup_appl(argv[0]);

    /* init logging */
    LOG_INIT_CONSOLE(LOG_NORMAL);

    LOG(LOG_DUMP, ("flagind %d\n", flagind));
    sprintf(flags_arr, "bdr%s", CRUNCH_FLAGS);
    while ((c = getflag(argc, argv, flags_arr)) != -1)
    {
        LOG(LOG_DUMP, (" flagind %d flagopt '%c'\n", flagind, c));
        switch (c)
        {
        case 'b':
            backwards_mode = 1;
            break;
        case 'r':
            reverse_mode = 1;
            break;
        default:
            handle_crunch_flags(c, flagarg, print_usage, appl, flags);
        }
    }

    infilev = argv + flagind;
    infilec = argc - flagind;

	/* only memory */
    if (0) if (infilec != 1)
    {
        LOG(LOG_ERROR, ("Error: exactly one input file must be given.\n"));
        print_usage(appl, LOG_NORMAL, DEFAULT_OUTFILE);
        exit(-1);
    }

    membuf_init(inbuf);
    membuf_init(outbuf);

	/* rustine */
    //read_file(infilev[0], inbuf);
	//void read_file(const char *name, struct membuf *buf)
#if 0
	{
    char block[1024];
    FILE *in;
    int len;

    in = fopen(name, "rb");
    if(in == NULL)
    {
        LOG(LOG_ERROR, ("Can't open file \"%s\" for input.\n", name));
        exit(-1);
    }
    do
    {
        len = fread(block, 1, 1024, in);
        membuf_append(buf, block, len);
    }
    while(len == 1024);
    LOG(LOG_DEBUG, ("read %d bytes from file\n", len));
    fclose(in);
	}
#endif
	
	membuf_append(inbuf, input_data, input_len);
	
	
    {
        struct crunch_info info[1];
        if(backwards_mode)
        {
            //JLOG(LOG_NORMAL, ("Crunching infile \"%s\" to outfile \"%s\" " "backwards.\n", infilev[0], flags->outfile));
            crunch_backwards(inbuf, outbuf, options, info);
        }
        else
        {
            //LOG(LOG_NORMAL, ("Crunching infile \"%s\" to outfile \"%s\".\n", infilev[0], flags->outfile));
            crunch(inbuf, outbuf, options, info);
        }

        //LOG(LOG_NORMAL, (" Literal sequences are %sused and", info->literal_sequences_used ? "" : "not "));
        //LOG(LOG_NORMAL, ("Mizoumizer info: the safety offset is %d.\n", info->needed_safety_offset));

    }

    if(reverse_mode)
    {
        reverse_buffer(membuf_get(outbuf), membuf_memlen(outbuf));
    }
	
#if 0	
    //write_file(flags->outfile, outbuf);
	//void write_file(const char *name, struct membuf *buf)
	{
    FILE *out;
    out = fopen(flags->outfile, "wb");
    if(out == NULL)
    {
        LOG(LOG_ERROR, ("Can't open file \"%s\" for output.\n", name));
        exit(-1);
    }
    fwrite(, 1, membuf_memlen(outbuf), out);
    fclose(out);
	}
#endif

	output_data=MemMalloc(membuf_memlen(outbuf));
	memcpy(output_data,membuf_get(outbuf),membuf_memlen(outbuf));
	*retlen=membuf_memlen(outbuf);
	
    membuf_free(outbuf);
    membuf_free(inbuf);

    LOG_FREE;

    return output_data;
}